

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_io_load
          (CompilerMSL *this,uint32_t result_type_id,uint32_t id,uint32_t ptr)

{
  Types TVar1;
  ID id_00;
  bool bVar2;
  bool bVar3;
  ExecutionModel EVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  SPIRType *pSVar9;
  undefined4 extraout_var;
  long *plVar10;
  undefined8 *puVar11;
  undefined4 extraout_var_00;
  SPIRType *pSVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  SPIRVariable *var;
  runtime_error *prVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong uVar17;
  byte bVar18;
  undefined4 uVar19;
  uint uVar20;
  undefined8 unaff_RBP;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  bool bVar23;
  uint32_t indices [3];
  string expr;
  AccessChainMeta meta;
  _Alloc_hider _Var24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  SPIRType *local_120;
  string local_118;
  ulong local_f8;
  ID local_ec;
  SPIRType *local_e8;
  string local_e0;
  string local_c0;
  ulong local_a0;
  string local_98;
  uint32_t local_74;
  SPIRType *local_70;
  SPIRType *local_68;
  undefined4 local_60;
  uint32_t local_5c;
  SPIRType *local_58;
  uint32_t local_4c;
  SPIRVariable *local_48;
  ulong local_40;
  ulong local_38;
  
  local_ec.id = ptr;
  local_5c = id;
  pSVar9 = Compiler::expression_type((Compiler *)this,ptr);
  local_4c = result_type_id;
  local_120 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + result_type_id);
  local_58 = pSVar9;
  if ((pSVar9->storage != StorageClassInput) &&
     ((pSVar9->storage != StorageClassOutput ||
      (EVar4 = Compiler::get_execution_model((Compiler *)this),
      EVar4 == ExecutionModelTessellationEvaluation)))) {
    return false;
  }
  EVar4 = Compiler::get_execution_model((Compiler *)this);
  pSVar9 = local_120;
  if ((EVar4 == ExecutionModelTessellationControl) &&
     ((this->msl_options).multi_patch_workgroup == true)) {
    uVar19 = (undefined4)
             CONCAT71((int7)((ulong)unaff_RBP >> 8),local_58->storage == StorageClassInput);
  }
  else {
    uVar19 = 0;
  }
  bVar2 = Compiler::is_matrix((Compiler *)this,local_120);
  bVar23 = local_58->storage == StorageClassInput;
  bVar18 = ((byte)uVar19 ^ 1) & bVar23 & bVar2;
  bVar2 = *(int *)&(pSVar9->super_IVariant).field_0xc != 0xf;
  local_60 = uVar19;
  if ((bVar18 == 0) &&
     (bVar3 = Compiler::is_array((Compiler *)this,pSVar9), !bVar3 && (bVar2 || !bVar23))) {
    return false;
  }
  id_00.id = local_ec.id;
  bVar3 = Compiler::has_decoration((Compiler *)this,local_ec,DecorationPatch);
  if (bVar3) {
    return false;
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  uVar5 = Compiler::get_extended_decoration
                    ((Compiler *)this,id_00.id,SPIRVCrossDecorationInterfaceMemberIndex);
  local_f8 = CONCAT44(extraout_var,uVar5);
  local_48 = Compiler::maybe_get_backing_variable((Compiler *)this,id_00.id);
  TVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
          ptr[id_00.id].type;
  local_68 = Compiler::get_pointee_type((Compiler *)this,(local_58->super_IVariant).self.id);
  local_70 = Compiler::expression_type((Compiler *)this,(this->stage_in_ptr_var_id).id);
  uVar17 = (local_120->array).super_VectorView<unsigned_int>.buffer_size;
  if (2 < uVar17) {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffec0,
               "Cannot load tessellation IO variables with more than 2 dimensions.","");
    ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
    *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (uVar17 == 2) {
    if (TVar1 != TypeVariable) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffec0,
                 "Loading an array-of-array must be loaded directly from an IO variable.","");
      ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
      *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((int)local_f8 == -1) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffec0,"Interface index is unknown. Cannot continue.",
                 "");
      ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
      *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((~bVar18 & *(int *)&(local_120->super_IVariant).field_0xc != 0xf) == 0) {
      prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffec0,
                 "Cannot load array-of-array of composite type in tessellation IO.","");
      ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
      *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_118,this,local_120,0);
    plVar10 = (long *)::std::__cxx11::string::append((char *)&local_118);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 == paVar13) {
      local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_130._8_8_ = plVar10[3];
      _Var24._M_p = (pointer)&local_130;
    }
    else {
      local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
      _Var24._M_p = (pointer)*plVar10;
    }
    *plVar10 = (long)paVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var24._M_p != &local_130) {
      operator_delete(_Var24._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    pSVar9 = local_120;
    uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_120,1);
    pSVar9 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (pSVar9->parent_type).id);
    if (uVar5 != 0) {
      local_e8 = (SPIRType *)((ulong)local_e8 & 0xffffffff00000000);
      local_70 = (SPIRType *)CONCAT44(local_70._4_4_,uVar5);
      do {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_118,this,pSVar9,0);
        puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar13) {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_130._8_8_ = puVar11[3];
          _Var24._M_p = (pointer)&local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          _Var24._M_p = (pointer)*puVar11;
        }
        *puVar11 = paVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var24._M_p != &local_130) {
          operator_delete(_Var24._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_120,0);
        if ((byte)local_60 == '\0') {
          if (uVar5 != 0) {
            local_a0 = (ulong)-uVar5;
            uVar20 = 1;
            uVar17 = local_f8 & 0xffffffff;
            do {
              local_118._M_dataplus._M_p = (pointer)CONCAT44((int)uVar17,(int)local_e8);
              local_98._M_dataplus._M_p = (pointer)0x0;
              CompilerGLSL::access_chain_internal_abi_cxx11_
                        ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                         (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,2,5,
                         (AccessChainMeta *)&local_98);
              ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var24._M_p != &local_130) {
                operator_delete(_Var24._M_p);
              }
              bVar2 = Compiler::is_matrix((Compiler *)this,pSVar9);
              if ((!bVar2 && *(int *)&(pSVar9->super_IVariant).field_0xc != 0xf) &&
                 (pSVar9->vecsize < local_68->vecsize)) {
                CompilerGLSL::vector_swizzle(pSVar9->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_c0);
              }
              if (uVar20 < uVar5) {
                ::std::__cxx11::string::append((char *)&local_c0);
              }
              uVar17 = (ulong)((int)uVar17 + 1);
              iVar6 = (int)local_a0 + uVar20;
              uVar20 = uVar20 + 1;
            } while (iVar6 != 0);
          }
        }
        else if (uVar5 != 0) {
          uVar20 = 0;
          do {
            local_118._M_dataplus._M_p = (pointer)CONCAT44((int)local_f8,(int)local_e8);
            local_118._M_string_length = CONCAT44(local_118._M_string_length._4_4_,uVar20);
            local_98._M_dataplus._M_p = (pointer)0x0;
            CompilerGLSL::access_chain_internal_abi_cxx11_
                      ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                       (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,3,5,
                       (AccessChainMeta *)&local_98);
            ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p != &local_130) {
              operator_delete(_Var24._M_p);
            }
            bVar2 = Compiler::is_matrix((Compiler *)this,pSVar9);
            if ((!bVar2 && *(int *)&(pSVar9->super_IVariant).field_0xc != 0xf) &&
               (pSVar9->vecsize < local_68->vecsize)) {
              CompilerGLSL::vector_swizzle(pSVar9->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_c0);
            }
            uVar20 = uVar20 + 1;
            if (uVar20 < uVar5) {
              ::std::__cxx11::string::append((char *)&local_c0);
            }
          } while (uVar5 != uVar20);
        }
        ::std::__cxx11::string::append((char *)&local_c0);
        uVar20 = (uint)local_70;
        uVar7 = (uint)local_e8 + 1;
        local_e8 = (SPIRType *)CONCAT44(local_e8._4_4_,uVar7);
        if (uVar7 < (uint)local_70) {
          ::std::__cxx11::string::append((char *)&local_c0);
        }
      } while ((uint)local_e8 != uVar20);
    }
    ::std::__cxx11::string::append((char *)&local_c0);
    goto LAB_00261797;
  }
  if (bVar2 || !bVar23) {
    if (bVar18 == 0) {
      if (TVar1 == TypeVariable) {
        bVar2 = Compiler::is_array((Compiler *)this,local_120);
        if (!bVar2) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1741,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x1742,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_f8 == -1) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffec0,
                     "Interface index is unknown. Cannot continue.","");
          ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
          *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_118,this,local_120,0);
        puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar13) {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_130._8_8_ = puVar11[3];
          _Var24._M_p = (pointer)&local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          _Var24._M_p = (pointer)*puVar11;
        }
        *puVar11 = paVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var24._M_p != &local_130) {
          operator_delete(_Var24._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_120,0);
        if (uVar5 != 0) {
          uVar20 = 0;
          do {
            local_118._M_dataplus._M_p._4_4_ = (int)local_f8;
            local_118._M_dataplus._M_p._0_4_ = uVar20;
            local_98._M_dataplus._M_p = (pointer)0x0;
            CompilerGLSL::access_chain_internal_abi_cxx11_
                      ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                       (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,2,5,
                       (AccessChainMeta *)&local_98);
            ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p != &local_130) {
              operator_delete(_Var24._M_p);
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_c0);
            }
            uVar20 = uVar20 + 1;
            if (uVar20 < uVar5) {
              ::std::__cxx11::string::append((char *)&local_c0);
            }
          } while (uVar5 != uVar20);
        }
        ::std::__cxx11::string::append((char *)&local_c0);
      }
      else {
        bVar2 = Compiler::is_array((Compiler *)this,local_120);
        if (!bVar2) {
          __assert_fail("is_array(result_type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x175d,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 1) {
          __assert_fail("result_type.array.size() == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x175e,
                        "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                       );
        }
        if ((int)local_f8 == -1) {
          prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xfffffffffffffec0,
                     "Interface index is unknown. Cannot continue.","");
          ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
          *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
          __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_118,this,local_120,0);
        puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar13) {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_130._8_8_ = puVar11[3];
          _Var24._M_p = (pointer)&local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          _Var24._M_p = (pointer)*puVar11;
        }
        *puVar11 = paVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var24._M_p != &local_130) {
          operator_delete(_Var24._M_p);
        }
        paVar13 = &local_118.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar13) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_120,0);
        if (uVar5 != 0) {
          uVar20 = 0;
          do {
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_98,&this->super_CompilerGLSL,local_ec.id,true);
            puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar16) {
              local_118.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_118.field_2._8_8_ = puVar11[3];
              local_118._M_dataplus._M_p = (pointer)paVar13;
            }
            else {
              local_118.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_118._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_118._M_string_length = puVar11[1];
            *puVar11 = paVar16;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_e0,&this->super_CompilerGLSL,local_70,(int)local_f8 + uVar20);
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar13) {
              uVar21 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length) {
              uVar21 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p) !=
                  &local_e0.field_2) {
                uVar21 = local_e0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length)
              goto LAB_00261677;
              puVar11 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_e0,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p)
              ;
            }
            else {
LAB_00261677:
              puVar11 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_118,
                                   (ulong)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                                   (uint)local_e0._M_dataplus._M_p));
            }
            _Var24._M_p = (pointer)&local_130;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar16) {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_130._8_8_ = puVar11[3];
            }
            else {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              _Var24._M_p = (pointer)*puVar11;
            }
            *puVar11 = paVar16;
            puVar11[1] = 0;
            paVar16->_M_local_buf[0] = '\0';
            ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p != &local_130) {
              operator_delete(_Var24._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p) !=
                &local_e0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                       (uint)local_e0._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar13) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_c0);
            }
            uVar20 = uVar20 + 1;
            if (uVar20 < uVar5) {
              ::std::__cxx11::string::append((char *)&local_c0);
            }
          } while (uVar5 != uVar20);
        }
        ::std::__cxx11::string::append((char *)&local_c0);
      }
    }
    else {
      bVar2 = Compiler::is_array((Compiler *)this,local_120);
      pSVar9 = local_120;
      if ((TVar1 != TypeVariable) && (bVar2)) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffec0,
                   "Loading array of matrix from IO variable must come directly from IO variable.",
                   "");
        ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
        *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((int)local_f8 == -1) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffec0,"Interface index is unknown. Cannot continue."
                   ,"");
        ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
        *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
        __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (bVar2) {
        uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_120,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_118,this,pSVar9,0);
        puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar13) {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_130._8_8_ = puVar11[3];
          _Var24._M_p = (pointer)&local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          _Var24._M_p = (pointer)*puVar11;
        }
        *puVar11 = paVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var24._M_p != &local_130) {
          operator_delete(_Var24._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        var = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + id_00.id);
        local_e8 = Compiler::get_variable_element_type((Compiler *)this,var);
        if (uVar5 != 0) {
          uVar20 = 0;
          local_a0 = CONCAT44(local_a0._4_4_,uVar5);
          do {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_118,this,local_e8,0);
            puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
            _Var24._M_p = (pointer)&local_130;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar13) {
              local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_130._8_8_ = puVar11[3];
            }
            else {
              local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
              _Var24._M_p = (pointer)*puVar11;
            }
            *puVar11 = paVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p != &local_130) {
              operator_delete(_Var24._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if (local_120->columns != 0) {
              uVar7 = 0;
              do {
                local_118._M_dataplus._M_p._4_4_ = (int)local_f8 + uVar7;
                local_118._M_dataplus._M_p._0_4_ = uVar20;
                local_98._M_dataplus._M_p = (pointer)0x0;
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                           (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,2,5,
                           (AccessChainMeta *)&local_98);
                ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var24._M_p != &local_130) {
                  operator_delete(_Var24._M_p);
                }
                if (local_120->vecsize < local_68->vecsize) {
                  CompilerGLSL::vector_swizzle(local_120->vecsize,0);
                  ::std::__cxx11::string::append((char *)&local_c0);
                }
                uVar7 = uVar7 + 1;
                uVar8 = local_120->columns;
                if (uVar7 < uVar8) {
                  ::std::__cxx11::string::append((char *)&local_c0);
                  uVar8 = local_120->columns;
                }
              } while (uVar7 < uVar8);
            }
            ::std::__cxx11::string::append((char *)&local_c0);
            uVar7 = (uint)local_a0;
            uVar20 = uVar20 + 1;
            if (uVar20 < (uint)local_a0) {
              ::std::__cxx11::string::append((char *)&local_c0);
            }
          } while (uVar20 != uVar7);
        }
        ::std::__cxx11::string::append((char *)&local_c0);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_118,this,local_120,0);
        puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 == paVar13) {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_130._8_8_ = puVar11[3];
          _Var24._M_p = (pointer)&local_130;
        }
        else {
          local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
          _Var24._M_p = (pointer)*puVar11;
        }
        *puVar11 = paVar13;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var24._M_p != &local_130) {
          operator_delete(_Var24._M_p);
        }
        paVar13 = &local_118.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar13) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if (local_120->columns != 0) {
          uVar20 = 0;
          do {
            CompilerGLSL::to_expression_abi_cxx11_
                      (&local_98,&this->super_CompilerGLSL,local_ec.id,true);
            puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar16) {
              local_118.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_118.field_2._8_8_ = puVar11[3];
              local_118._M_dataplus._M_p = (pointer)paVar13;
            }
            else {
              local_118.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_118._M_dataplus._M_p = (pointer)*puVar11;
            }
            local_118._M_string_length = puVar11[1];
            *puVar11 = paVar16;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            CompilerGLSL::to_member_name_abi_cxx11_
                      (&local_e0,&this->super_CompilerGLSL,local_70,(int)local_f8 + uVar20);
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar13) {
              uVar21 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length) {
              uVar21 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p) !=
                  &local_e0.field_2) {
                uVar21 = local_e0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length)
              goto LAB_00261041;
              puVar11 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_e0,0,(char *)0x0,(ulong)local_118._M_dataplus._M_p)
              ;
            }
            else {
LAB_00261041:
              puVar11 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&local_118,
                                   (ulong)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                                   (uint)local_e0._M_dataplus._M_p));
            }
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar16) {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              local_130._8_8_ = puVar11[3];
              _Var24._M_p = (pointer)&local_130;
            }
            else {
              local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
              _Var24._M_p = (pointer)*puVar11;
            }
            *puVar11 = paVar16;
            puVar11[1] = 0;
            paVar16->_M_local_buf[0] = '\0';
            ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p != &local_130) {
              operator_delete(_Var24._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p) !=
                &local_e0.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                       (uint)local_e0._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar13) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            if (local_120->vecsize < local_68->vecsize) {
              CompilerGLSL::vector_swizzle(local_120->vecsize,0);
              ::std::__cxx11::string::append((char *)&local_c0);
            }
            uVar20 = uVar20 + 1;
            uVar7 = local_120->columns;
            if (uVar20 < uVar7) {
              ::std::__cxx11::string::append((char *)&local_c0);
              uVar7 = local_120->columns;
            }
          } while (uVar20 < uVar7);
        }
        ::std::__cxx11::string::append((char *)&local_c0);
      }
    }
    goto LAB_00261797;
  }
  bVar2 = Compiler::is_array((Compiler *)this,local_120);
  pSVar9 = local_120;
  local_e8 = (SPIRType *)CONCAT71(local_e8._1_7_,bVar2);
  if ((TVar1 != TypeVariable) && (bVar2)) {
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffec0,
               "Loading array of struct from IO variable must come directly from IO variable.","");
    ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
    *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
    __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (bVar2) {
    local_74 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_120,0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_118,this,pSVar9,0);
    puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar13) {
      local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_130._8_8_ = puVar11[3];
      _Var24._M_p = (pointer)&local_130;
    }
    else {
      local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
      _Var24._M_p = (pointer)*puVar11;
    }
    *puVar11 = paVar13;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var24._M_p != &local_130) {
      operator_delete(_Var24._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    local_120 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_120->parent_type).id)
    ;
    if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 0) {
LAB_00261a4e:
      __assert_fail("struct_type.array.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x1693,
                    "bool spirv_cross::CompilerMSL::emit_tessellation_io_load(uint32_t, uint32_t, uint32_t)"
                   );
    }
    if (local_74 != 0) goto LAB_002601c2;
  }
  else {
    local_74 = 1;
    if ((local_120->array).super_VectorView<unsigned_int>.buffer_size != 0) goto LAB_00261a4e;
LAB_002601c2:
    local_a0 = 0;
    do {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_118,this,local_120,0)
      ;
      puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
      _Var24._M_p = (pointer)&local_130;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar11 == paVar13) {
        local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_130._8_8_ = puVar11[3];
      }
      else {
        local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
        _Var24._M_p = (pointer)*puVar11;
      }
      *puVar11 = paVar13;
      puVar11[1] = 0;
      *(undefined1 *)(puVar11 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var24._M_p != &local_130) {
        operator_delete(_Var24._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((int)(local_120->member_types).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0) {
        uVar17 = 0;
        do {
          if (local_48 != (SPIRVariable *)0x0) {
            uVar5 = Compiler::get_extended_member_decoration
                              ((Compiler *)this,(local_48->super_IVariant).self.id,(uint32_t)uVar17,
                               SPIRVCrossDecorationInterfaceMemberIndex);
            local_f8 = CONCAT44(extraout_var_00,uVar5);
          }
          if ((int)local_f8 == -1) {
            prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xfffffffffffffec0,
                       "Interface index is unknown. Cannot continue.","");
            ::std::runtime_error::runtime_error(prVar15,(string *)&stack0xfffffffffffffec0);
            *(undefined ***)prVar15 = &PTR__runtime_error_00357118;
            __cxa_throw(prVar15,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          pSVar9 = Variant::get<spirv_cross::SPIRType>
                             ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr +
                              (local_120->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                              [uVar17].id);
          local_40 = uVar17;
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               (local_68->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [uVar17].id);
          bVar2 = Compiler::is_matrix((Compiler *)this,pSVar9);
          if (((local_58->storage != StorageClassInput | (byte)local_60 | ~bVar2) & 1) == 0) {
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&local_118,this,pSVar9,0);
            puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
            _Var24._M_p = (pointer)&local_130;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar11 == paVar13) {
              local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_130._8_8_ = puVar11[3];
            }
            else {
              local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
              _Var24._M_p = (pointer)*puVar11;
            }
            *puVar11 = paVar13;
            puVar11[1] = 0;
            *(undefined1 *)(puVar11 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p != &local_130) {
              operator_delete(_Var24._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            if (pSVar9->columns != 0) {
              uVar20 = 0;
              do {
                uVar5 = (int)local_f8 + uVar20;
                if ((char)local_e8 == '\0') {
                  CompilerGLSL::to_expression_abi_cxx11_
                            (&local_98,&this->super_CompilerGLSL,local_ec.id,true);
                  puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 == paVar13) {
                    local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_118.field_2._8_8_ = puVar11[3];
                  }
                  else {
                    local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_118._M_dataplus._M_p = (pointer)*puVar11;
                  }
                  local_118._M_string_length = puVar11[1];
                  *puVar11 = paVar13;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  CompilerGLSL::to_member_name_abi_cxx11_
                            (&local_e0,&this->super_CompilerGLSL,local_70,uVar5);
                  uVar21 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    uVar21 = local_118.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length) {
                    uVar21 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p)
                        != &local_e0.field_2) {
                      uVar21 = local_e0.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length)
                    goto LAB_00260649;
                    puVar11 = (undefined8 *)
                              ::std::__cxx11::string::replace
                                        ((ulong)&local_e0,0,(char *)0x0,
                                         (ulong)local_118._M_dataplus._M_p);
                  }
                  else {
LAB_00260649:
                    puVar11 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        ((char *)&local_118,
                                         (ulong)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                                         (uint)local_e0._M_dataplus._M_p));
                  }
                  _Var24._M_p = (pointer)&local_130;
                  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar11 == paVar13) {
                    local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_130._8_8_ = puVar11[3];
                  }
                  else {
                    local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    _Var24._M_p = (pointer)*puVar11;
                  }
                  *puVar11 = paVar13;
                  puVar11[1] = 0;
                  paVar13->_M_local_buf[0] = '\0';
                  ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var24._M_p != &local_130) {
                    operator_delete(_Var24._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p)
                      != &local_e0.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                             (uint)local_e0._M_dataplus._M_p));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                  paVar13 = &local_98.field_2;
                  _Var22._M_p = local_98._M_dataplus._M_p;
                }
                else {
                  local_118._M_dataplus._M_p = (pointer)CONCAT44(uVar5,(int)local_a0);
                  local_98._M_dataplus._M_p = (pointer)0x0;
                  CompilerGLSL::access_chain_internal_abi_cxx11_
                            ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                             (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,2,5,
                             (AccessChainMeta *)&local_98);
                  ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                  paVar13 = &local_130;
                  _Var22._M_p = _Var24._M_p;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var22._M_p != paVar13) {
                  operator_delete(_Var22._M_p);
                }
                if (pSVar9->vecsize < pSVar12->vecsize) {
                  CompilerGLSL::vector_swizzle(pSVar9->vecsize,0);
                  ::std::__cxx11::string::append((char *)&local_c0);
                }
                uVar20 = uVar20 + 1;
                uVar7 = pSVar9->columns;
                if (uVar20 < uVar7) {
                  ::std::__cxx11::string::append((char *)&local_c0);
                  uVar7 = pSVar9->columns;
                }
              } while (uVar20 < uVar7);
              local_f8 = (ulong)((int)local_f8 + uVar20);
            }
            ::std::__cxx11::string::append((char *)&local_c0);
          }
          else {
            bVar2 = Compiler::is_array((Compiler *)this,pSVar9);
            if (bVar2) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_118,this,pSVar9,0);
              puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_118);
              _Var24._M_p = (pointer)&local_130;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 == paVar13) {
                local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_130._8_8_ = puVar11[3];
              }
              else {
                local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                _Var24._M_p = (pointer)*puVar11;
              }
              *puVar11 = paVar13;
              puVar11[1] = 0;
              *(undefined1 *)(puVar11 + 2) = 0;
              ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var24._M_p != &local_130) {
                operator_delete(_Var24._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
              uVar5 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar9,0);
              if ((byte)local_60 == '\0') {
                if (uVar5 != 0) {
                  local_38 = (ulong)-uVar5;
                  uVar20 = 1;
                  do {
                    if ((char)local_e8 == '\0') {
                      CompilerGLSL::to_expression_abi_cxx11_
                                (&local_98,&this->super_CompilerGLSL,local_ec.id,true);
                      puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
                      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(puVar11 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11 == paVar13) {
                        local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                        local_118.field_2._8_8_ = puVar11[3];
                      }
                      else {
                        local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                        local_118._M_dataplus._M_p = (pointer)*puVar11;
                      }
                      local_118._M_string_length = puVar11[1];
                      *puVar11 = paVar13;
                      puVar11[1] = 0;
                      *(undefined1 *)(puVar11 + 2) = 0;
                      CompilerGLSL::to_member_name_abi_cxx11_
                                (&local_e0,&this->super_CompilerGLSL,local_70,(uint32_t)local_f8);
                      uVar21 = 0xf;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != &local_118.field_2) {
                        uVar21 = local_118.field_2._M_allocated_capacity;
                      }
                      if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length) {
                        uVar21 = 0xf;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                        (uint)local_e0._M_dataplus._M_p) != &local_e0.field_2) {
                          uVar21 = local_e0.field_2._M_allocated_capacity;
                        }
                        if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length)
                        goto LAB_00260b7c;
                        puVar11 = (undefined8 *)
                                  ::std::__cxx11::string::replace
                                            ((ulong)&local_e0,0,(char *)0x0,
                                             (ulong)local_118._M_dataplus._M_p);
                      }
                      else {
LAB_00260b7c:
                        puVar11 = (undefined8 *)
                                  ::std::__cxx11::string::_M_append
                                            ((char *)&local_118,
                                             (ulong)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                                             (uint)local_e0._M_dataplus._M_p));
                      }
                      _Var24._M_p = (pointer)&local_130;
                      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(puVar11 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*puVar11 == paVar13) {
                        local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                        local_130._8_8_ = puVar11[3];
                      }
                      else {
                        local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                        _Var24._M_p = (pointer)*puVar11;
                      }
                      *puVar11 = paVar13;
                      puVar11[1] = 0;
                      paVar13->_M_local_buf[0] = '\0';
                      ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var24._M_p != &local_130) {
                        operator_delete(_Var24._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                      (uint)local_e0._M_dataplus._M_p) != &local_e0.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                                 (uint)local_e0._M_dataplus._M_p));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != &local_118.field_2) {
                        operator_delete(local_118._M_dataplus._M_p);
                      }
                      paVar13 = &local_98.field_2;
                      _Var22._M_p = local_98._M_dataplus._M_p;
                    }
                    else {
                      local_118._M_dataplus._M_p = (pointer)CONCAT44((int)local_f8,(int)local_a0);
                      local_98._M_dataplus._M_p = (pointer)0x0;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                                 (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,2,5,
                                 (AccessChainMeta *)&local_98);
                      ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                      paVar13 = &local_130;
                      _Var22._M_p = _Var24._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var22._M_p != paVar13) {
                      operator_delete(_Var22._M_p);
                    }
                    if (pSVar9->vecsize < pSVar12->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar9->vecsize,0);
                      ::std::__cxx11::string::append((char *)&local_c0);
                    }
                    if (uVar20 < uVar5) {
                      ::std::__cxx11::string::append((char *)&local_c0);
                    }
                    local_f8 = (ulong)((int)local_f8 + 1);
                    iVar6 = (int)local_38 + uVar20;
                    uVar20 = uVar20 + 1;
                  } while (iVar6 != 0);
                }
              }
              else {
                local_e0._M_dataplus._M_p._0_4_ = 0;
                if (uVar5 != 0) {
                  do {
                    if ((char)local_e8 == '\0') {
                      CompilerGLSL::to_expression_abi_cxx11_
                                (&local_118,&this->super_CompilerGLSL,local_ec.id,true);
                      CompilerGLSL::to_member_name_abi_cxx11_
                                (&local_98,&this->super_CompilerGLSL,local_70,(uint32_t)local_f8);
                      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                                ((string *)&stack0xfffffffffffffec0,(spirv_cross *)&local_118,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x2dfc12,(char (*) [2])&local_98,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)0x2f169e,(char (*) [2])&local_e0,(uint *)0x2e390f,
                                 (char (*) [2])_Var24._M_p);
                      ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var24._M_p != &local_130) {
                        operator_delete(_Var24._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_98._M_dataplus._M_p != &local_98.field_2) {
                        operator_delete(local_98._M_dataplus._M_p);
                      }
                      paVar13 = &local_118.field_2;
                      _Var22._M_p = local_118._M_dataplus._M_p;
                    }
                    else {
                      local_118._M_dataplus._M_p = (pointer)CONCAT44((int)local_f8,(int)local_a0);
                      local_118._M_string_length =
                           CONCAT44(local_118._M_string_length._4_4_,(uint)local_e0._M_dataplus._M_p
                                   );
                      local_98._M_dataplus._M_p = (pointer)0x0;
                      CompilerGLSL::access_chain_internal_abi_cxx11_
                                ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                                 (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,3,5,
                                 (AccessChainMeta *)&local_98);
                      ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                      paVar13 = &local_130;
                      _Var22._M_p = _Var24._M_p;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var22._M_p != paVar13) {
                      operator_delete(_Var22._M_p);
                    }
                    if (pSVar9->vecsize < pSVar12->vecsize) {
                      CompilerGLSL::vector_swizzle(pSVar9->vecsize,0);
                      ::std::__cxx11::string::append((char *)&local_c0);
                    }
                    uVar20 = (uint)local_e0._M_dataplus._M_p + 1;
                    if (uVar20 < uVar5) {
                      ::std::__cxx11::string::append((char *)&local_c0);
                      uVar20 = (uint)local_e0._M_dataplus._M_p + 1;
                    }
                    local_e0._M_dataplus._M_p._0_4_ = uVar20;
                  } while (uVar20 < uVar5);
                }
              }
              ::std::__cxx11::string::append((char *)&local_c0);
            }
            else {
              if ((char)local_e8 == '\0') {
                CompilerGLSL::to_expression_abi_cxx11_
                          (&local_98,&this->super_CompilerGLSL,local_ec.id,true);
                puVar11 = (undefined8 *)::std::__cxx11::string::append((char *)&local_98);
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 == paVar13) {
                  local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_118.field_2._8_8_ = puVar11[3];
                }
                else {
                  local_118.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_118._M_dataplus._M_p = (pointer)*puVar11;
                }
                local_118._M_string_length = puVar11[1];
                *puVar11 = paVar13;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                CompilerGLSL::to_member_name_abi_cxx11_
                          (&local_e0,&this->super_CompilerGLSL,local_70,(uint32_t)local_f8);
                uVar21 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  uVar21 = local_118.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length) {
                  uVar21 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p)
                      != &local_e0.field_2) {
                    uVar21 = local_e0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar21 < local_e0._M_string_length + local_118._M_string_length)
                  goto LAB_00260d4b;
                  puVar11 = (undefined8 *)
                            ::std::__cxx11::string::replace
                                      ((ulong)&local_e0,0,(char *)0x0,
                                       (ulong)local_118._M_dataplus._M_p);
                }
                else {
LAB_00260d4b:
                  puVar11 = (undefined8 *)
                            ::std::__cxx11::string::_M_append
                                      ((char *)&local_118,
                                       (ulong)CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                                       (uint)local_e0._M_dataplus._M_p));
                }
                _Var24._M_p = (pointer)&local_130;
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar11 == paVar13) {
                  local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_130._8_8_ = puVar11[3];
                }
                else {
                  local_130._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  _Var24._M_p = (pointer)*puVar11;
                }
                *puVar11 = paVar13;
                puVar11[1] = 0;
                paVar13->_M_local_buf[0] = '\0';
                ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var24._M_p != &local_130) {
                  operator_delete(_Var24._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(uint)local_e0._M_dataplus._M_p) !=
                    &local_e0.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_e0._M_dataplus._M_p._4_4_,
                                           (uint)local_e0._M_dataplus._M_p));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p);
                }
                paVar13 = &local_98.field_2;
                _Var22._M_p = local_98._M_dataplus._M_p;
              }
              else {
                local_118._M_dataplus._M_p = (pointer)CONCAT44((int)local_f8,(int)local_a0);
                local_98._M_dataplus._M_p = (pointer)0x0;
                CompilerGLSL::access_chain_internal_abi_cxx11_
                          ((string *)&stack0xfffffffffffffec0,&this->super_CompilerGLSL,
                           (this->stage_in_ptr_var_id).id,(uint32_t *)&local_118,2,5,
                           (AccessChainMeta *)&local_98);
                ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)_Var24._M_p);
                paVar13 = &local_130;
                _Var22._M_p = _Var24._M_p;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var22._M_p != paVar13) {
                operator_delete(_Var22._M_p);
              }
              if (pSVar9->vecsize < pSVar12->vecsize) {
                CompilerGLSL::vector_swizzle(pSVar9->vecsize,0);
                ::std::__cxx11::string::append((char *)&local_c0);
              }
            }
          }
          uVar17 = local_40 + 1;
          uVar14 = (local_120->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          if (uVar17 < uVar14) {
            ::std::__cxx11::string::append((char *)&local_c0);
            uVar14 = (ulong)(uint)(local_120->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                  buffer_size;
          }
        } while (uVar17 < (uVar14 & 0xffffffff));
      }
      ::std::__cxx11::string::append((char *)&local_c0);
      uVar20 = (int)local_a0 + 1;
      local_a0 = (ulong)uVar20;
      if (uVar20 < local_74) {
        ::std::__cxx11::string::append((char *)&local_c0);
      }
    } while ((uint32_t)local_a0 != local_74);
    if ((char)local_e8 == '\0') goto LAB_00261797;
  }
  ::std::__cxx11::string::append((char *)&local_c0);
LAB_00261797:
  CompilerGLSL::emit_op(&this->super_CompilerGLSL,local_4c,local_5c,&local_c0,false,false);
  Compiler::register_read((Compiler *)this,local_5c,local_ec.id,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool CompilerMSL::emit_tessellation_io_load(uint32_t result_type_id, uint32_t id, uint32_t ptr)
{
	auto &ptr_type = expression_type(ptr);
	auto &result_type = get<SPIRType>(result_type_id);
	if (ptr_type.storage != StorageClassInput && ptr_type.storage != StorageClassOutput)
		return false;
	if (ptr_type.storage == StorageClassOutput && get_execution_model() == ExecutionModelTessellationEvaluation)
		return false;

	bool multi_patch_tess_ctl = get_execution_model() == ExecutionModelTessellationControl &&
	                            msl_options.multi_patch_workgroup && ptr_type.storage == StorageClassInput;
	bool flat_matrix = is_matrix(result_type) && ptr_type.storage == StorageClassInput && !multi_patch_tess_ctl;
	bool flat_struct = result_type.basetype == SPIRType::Struct && ptr_type.storage == StorageClassInput;
	bool flat_data_type = flat_matrix || is_array(result_type) || flat_struct;
	if (!flat_data_type)
		return false;

	if (has_decoration(ptr, DecorationPatch))
		return false;

	// Now, we must unflatten a composite type and take care of interleaving array access with gl_in/gl_out.
	// Lots of painful code duplication since we *really* should not unroll these kinds of loads in entry point fixup
	// unless we're forced to do this when the code is emitting inoptimal OpLoads.
	string expr;

	uint32_t interface_index = get_extended_decoration(ptr, SPIRVCrossDecorationInterfaceMemberIndex);
	auto *var = maybe_get_backing_variable(ptr);
	bool ptr_is_io_variable = ir.ids[ptr].get_type() == TypeVariable;
	auto &expr_type = get_pointee_type(ptr_type.self);

	const auto &iface_type = expression_type(stage_in_ptr_var_id);

	if (result_type.array.size() > 2)
	{
		SPIRV_CROSS_THROW("Cannot load tessellation IO variables with more than 2 dimensions.");
	}
	else if (result_type.array.size() == 2)
	{
		if (!ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading an array-of-array must be loaded directly from an IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");
		if (result_type.basetype == SPIRType::Struct || flat_matrix)
			SPIRV_CROSS_THROW("Cannot load array-of-array of composite type in tessellation IO.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 1);
		uint32_t base_interface_index = interface_index;

		auto &sub_type = get<SPIRType>(result_type.parent_type);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(sub_type) + "({ ";
			interface_index = base_interface_index;
			uint32_t array_size = to_array_size_literal(result_type, 0);
			if (multi_patch_tess_ctl)
			{
				for (uint32_t j = 0; j < array_size; j++)
				{
					const uint32_t indices[3] = { i, interface_index, j };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 3,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					// If the expression has more vector components than the result type, insert
					// a swizzle. This shouldn't happen normally on valid SPIR-V, but it might
					// happen if we replace the type of an input variable.
					if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					    expr_type.vecsize > sub_type.vecsize)
						expr += vector_swizzle(sub_type.vecsize, 0);

					if (j + 1 < array_size)
						expr += ", ";
				}
			}
			else
			{
				for (uint32_t j = 0; j < array_size; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (!is_matrix(sub_type) && sub_type.basetype != SPIRType::Struct &&
					    expr_type.vecsize > sub_type.vecsize)
						expr += vector_swizzle(sub_type.vecsize, 0);

					if (j + 1 < array_size)
						expr += ", ";
				}
			}
			expr += " })";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else if (flat_struct)
	{
		bool is_array_of_struct = is_array(result_type);
		if (is_array_of_struct && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of struct from IO variable must come directly from IO variable.");

		uint32_t num_control_points = 1;
		if (is_array_of_struct)
		{
			num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";
		}

		auto &struct_type = is_array_of_struct ? get<SPIRType>(result_type.parent_type) : result_type;
		assert(struct_type.array.empty());

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			expr += type_to_glsl(struct_type) + "{ ";
			for (uint32_t j = 0; j < uint32_t(struct_type.member_types.size()); j++)
			{
				// The base interface index is stored per variable for structs.
				if (var)
				{
					interface_index =
					    get_extended_member_decoration(var->self, j, SPIRVCrossDecorationInterfaceMemberIndex);
				}

				if (interface_index == uint32_t(-1))
					SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

				const auto &mbr_type = get<SPIRType>(struct_type.member_types[j]);
				const auto &expr_mbr_type = get<SPIRType>(expr_type.member_types[j]);
				if (is_matrix(mbr_type) && ptr_type.storage == StorageClassInput && !multi_patch_tess_ctl)
				{
					expr += type_to_glsl(mbr_type) + "(";
					for (uint32_t k = 0; k < mbr_type.columns; k++, interface_index++)
					{
						if (is_array_of_struct)
						{
							const uint32_t indices[2] = { i, interface_index };
							AccessChainMeta meta;
							expr += access_chain_internal(
							    stage_in_ptr_var_id, indices, 2,
							    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
						}
						else
							expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
						if (expr_mbr_type.vecsize > mbr_type.vecsize)
							expr += vector_swizzle(mbr_type.vecsize, 0);

						if (k + 1 < mbr_type.columns)
							expr += ", ";
					}
					expr += ")";
				}
				else if (is_array(mbr_type))
				{
					expr += type_to_glsl(mbr_type) + "({ ";
					uint32_t array_size = to_array_size_literal(mbr_type, 0);
					if (multi_patch_tess_ctl)
					{
						for (uint32_t k = 0; k < array_size; k++)
						{
							if (is_array_of_struct)
							{
								const uint32_t indices[3] = { i, interface_index, k };
								AccessChainMeta meta;
								expr += access_chain_internal(
								    stage_in_ptr_var_id, indices, 3,
								    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
							}
							else
								expr += join(to_expression(ptr), ".", to_member_name(iface_type, interface_index), "[",
								             k, "]");
							if (expr_mbr_type.vecsize > mbr_type.vecsize)
								expr += vector_swizzle(mbr_type.vecsize, 0);

							if (k + 1 < array_size)
								expr += ", ";
						}
					}
					else
					{
						for (uint32_t k = 0; k < array_size; k++, interface_index++)
						{
							if (is_array_of_struct)
							{
								const uint32_t indices[2] = { i, interface_index };
								AccessChainMeta meta;
								expr += access_chain_internal(
								    stage_in_ptr_var_id, indices, 2,
								    ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
							}
							else
								expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
							if (expr_mbr_type.vecsize > mbr_type.vecsize)
								expr += vector_swizzle(mbr_type.vecsize, 0);

							if (k + 1 < array_size)
								expr += ", ";
						}
					}
					expr += " })";
				}
				else
				{
					if (is_array_of_struct)
					{
						const uint32_t indices[2] = { i, interface_index };
						AccessChainMeta meta;
						expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
						                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT,
						                              &meta);
					}
					else
						expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
					if (expr_mbr_type.vecsize > mbr_type.vecsize)
						expr += vector_swizzle(mbr_type.vecsize, 0);
				}

				if (j + 1 < struct_type.member_types.size())
					expr += ", ";
			}
			expr += " }";
			if (i + 1 < num_control_points)
				expr += ", ";
		}
		if (is_array_of_struct)
			expr += " })";
	}
	else if (flat_matrix)
	{
		bool is_array_of_matrix = is_array(result_type);
		if (is_array_of_matrix && !ptr_is_io_variable)
			SPIRV_CROSS_THROW("Loading array of matrix from IO variable must come directly from IO variable.");
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		if (is_array_of_matrix)
		{
			// Loading a matrix from each control point.
			uint32_t base_interface_index = interface_index;
			uint32_t num_control_points = to_array_size_literal(result_type, 0);
			expr += type_to_glsl(result_type) + "({ ";

			auto &matrix_type = get_variable_element_type(get<SPIRVariable>(ptr));

			for (uint32_t i = 0; i < num_control_points; i++)
			{
				interface_index = base_interface_index;
				expr += type_to_glsl(matrix_type) + "(";
				for (uint32_t j = 0; j < result_type.columns; j++, interface_index++)
				{
					const uint32_t indices[2] = { i, interface_index };

					AccessChainMeta meta;
					expr +=
					    access_chain_internal(stage_in_ptr_var_id, indices, 2,
					                          ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
					if (expr_type.vecsize > result_type.vecsize)
						expr += vector_swizzle(result_type.vecsize, 0);
					if (j + 1 < result_type.columns)
						expr += ", ";
				}
				expr += ")";
				if (i + 1 < num_control_points)
					expr += ", ";
			}

			expr += " })";
		}
		else
		{
			expr += type_to_glsl(result_type) + "(";
			for (uint32_t i = 0; i < result_type.columns; i++, interface_index++)
			{
				expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
				if (expr_type.vecsize > result_type.vecsize)
					expr += vector_swizzle(result_type.vecsize, 0);
				if (i + 1 < result_type.columns)
					expr += ", ";
			}
			expr += ")";
		}
	}
	else if (ptr_is_io_variable)
	{
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		// We're loading an array directly from a global variable.
		// This means we're loading one member from each control point.
		expr += type_to_glsl(result_type) + "({ ";
		uint32_t num_control_points = to_array_size_literal(result_type, 0);

		for (uint32_t i = 0; i < num_control_points; i++)
		{
			const uint32_t indices[2] = { i, interface_index };

			AccessChainMeta meta;
			expr += access_chain_internal(stage_in_ptr_var_id, indices, 2,
			                              ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_PTR_CHAIN_BIT, &meta);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);

			if (i + 1 < num_control_points)
				expr += ", ";
		}
		expr += " })";
	}
	else
	{
		// We're loading an array from a concrete control point.
		assert(is_array(result_type));
		assert(result_type.array.size() == 1);
		if (interface_index == uint32_t(-1))
			SPIRV_CROSS_THROW("Interface index is unknown. Cannot continue.");

		expr += type_to_glsl(result_type) + "({ ";
		uint32_t array_size = to_array_size_literal(result_type, 0);
		for (uint32_t i = 0; i < array_size; i++, interface_index++)
		{
			expr += to_expression(ptr) + "." + to_member_name(iface_type, interface_index);
			if (expr_type.vecsize > result_type.vecsize)
				expr += vector_swizzle(result_type.vecsize, 0);
			if (i + 1 < array_size)
				expr += ", ";
		}
		expr += " })";
	}

	emit_op(result_type_id, id, expr, false);
	register_read(id, ptr, false);
	return true;
}